

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_noevict::test_method(addrman_noevict *this)

{
  undefined1 **ppuVar1;
  _Head_base<0UL,_AddrMan_*,_false> _Var2;
  readonly_property65 rVar3;
  bool bVar4;
  int32_t consistency_check_ratio;
  uint uVar5;
  int iVar6;
  AddrMan *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  time_point tVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<CAddress> __l;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  initializer_list<CAddress> __l_01;
  const_string file_06;
  const_string file_07;
  initializer_list<CAddress> __l_02;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<CAddress> __l_03;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  __single_object addrman;
  CService addr59;
  CService addr36;
  CNetAddr source;
  check_type cVar13;
  char *pcVar12;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  _Head_base<0UL,_AddrMan_*,_false> local_270;
  char *local_268;
  assertion_result local_260;
  string *local_248;
  string *local_240;
  string *local_238;
  char *local_230;
  assertion_result local_228;
  direct_or_indirect local_210;
  uint local_200;
  undefined8 local_1f8;
  uint16_t local_1f0;
  string local_1e8;
  direct_or_indirect local_1c8;
  uint local_1b8;
  string **local_1b0;
  uint16_t local_1a8;
  direct_or_indirect local_1a0;
  uint local_190;
  string **local_188;
  uint16_t local_180;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_168;
  uint16_t local_158;
  direct_or_indirect local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint16_t local_130;
  NodeSeconds local_128;
  ServiceFlags local_120;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  direct_or_indirect local_f0;
  uint local_e0;
  undefined8 local_d8;
  uint16_t local_d0;
  direct_or_indirect local_c8;
  uint local_b8;
  undefined8 local_b0;
  uint16_t local_a8;
  direct_or_indirect local_a0;
  uint local_90;
  undefined8 local_88;
  uint16_t local_80;
  direct_or_indirect local_78;
  uint local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  this_00 = (AddrMan *)operator_new(8);
  AddrMan::AddrMan(this_00,&EMPTY_NETGROUPMAN,true,consistency_check_ratio);
  local_150.indirect_contents.indirect = (char *)&local_140;
  local_270._M_head_impl = this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_78.indirect_contents,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.indirect_contents.indirect != &local_140) {
    operator_delete(local_150.indirect_contents.indirect,
                    (ulong)(local_140._M_allocated_capacity + 1));
  }
  local_1e8._M_dataplus._M_p._0_4_ = 1;
  do {
    util::ToString<unsigned_int>((string *)local_178,(uint *)&local_1e8);
    pvVar10 = &DAT_00000008;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_178,0,0,"250.1.1.",8);
    local_150.indirect_contents.indirect = (char *)&local_140;
    ppuVar1 = (undefined1 **)(pbVar7->_M_dataplus)._M_p;
    paVar9 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppuVar1 == paVar9) {
      local_140._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_140._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_140._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_150.indirect_contents.indirect = (char *)ppuVar1;
    }
    local_150._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_a0.indirect_contents,(string *)&local_150,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.indirect_contents.indirect != &local_140) {
      operator_delete(local_150.indirect_contents.indirect,
                      (ulong)(local_140._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._0_8_ != &aStack_168) {
      operator_delete((void *)local_178._0_8_,aStack_168._M_allocated_capacity + 1);
    }
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_278 = "";
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x359;
    file.m_begin = (iterator)&local_280;
    msg.m_end = in_R9;
    msg.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_290,msg);
    _Var2._M_head_impl = local_270._M_head_impl;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_c8.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a0.indirect_contents);
    local_b0 = local_88;
    local_a8 = local_80;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_c8.indirect_contents);
    local_140._8_8_ = local_b0;
    local_130 = local_a8;
    local_128.__d.__r = (duration)100000000;
    local_120 = NODE_NONE;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_150;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260,__l,
               (allocator_type *)&local_228);
    rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         AddrMan::Add(_Var2._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_260,
                      (CNetAddr *)&local_78.indirect_contents,(seconds)0x0);
    local_58[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
    local_58._8_8_ = (element_type *)0x0;
    aStack_48._M_allocated_capacity = 0;
    local_110._0_8_ = "addrman->Add({CAddress(addr, NODE_NONE)}, source)";
    local_110._8_8_ = "";
    local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
    local_178._0_8_ = &PTR__lazy_ostream_013d3df0;
    aStack_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_168._8_8_ = local_110;
    local_2a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_298 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,(lazy_ostream *)local_178,1,0,WARN,_cVar13,
               (size_t)&local_2a0,0x359);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260);
    if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
      free(local_150.indirect_contents.indirect);
      local_150.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < local_b8) {
      free(local_c8.indirect_contents.indirect);
      local_c8.indirect_contents.indirect = (char *)0x0;
    }
    local_2b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_2a8 = "";
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x35c;
    file_00.m_begin = (iterator)&local_2b0;
    msg_00.m_end = pvVar11;
    msg_00.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c0,
               msg_00);
    _Var2._M_head_impl = local_270._M_head_impl;
    tVar8 = NodeClock::now();
    bVar4 = AddrMan::Good(_Var2._M_head_impl,(CService *)&local_a0.indirect_contents,
                          (NodeSeconds)((long)tVar8.__d.__r / 1000000000));
    local_178[0] = bVar4;
    local_178._8_8_ = (element_type *)0x0;
    aStack_168._M_allocated_capacity = 0;
    local_58._0_8_ = "addrman->Good(addr)";
    local_58._8_8_ = "";
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_2d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_2c8 = "";
    pvVar10 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    local_140._8_8_ = (assertion_result *)local_58;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_178,(lazy_ostream *)&local_150,1,0,WARN,_cVar13,
               (size_t)&local_2d0,0x35c);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_168._M_allocated_capacity);
    if (0x10 < local_90) {
      free(local_a0.indirect_contents.indirect);
      local_a0.indirect_contents.indirect = (char *)0x0;
    }
    uVar5 = (uint)local_1e8._M_dataplus._M_p + 1;
    local_1e8._M_dataplus._M_p._0_4_ = uVar5;
  } while (uVar5 < 0x24);
  local_150.indirect_contents.indirect = (char *)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"250.1.1.36","");
  ResolveService((CService *)&local_a0.indirect_contents,(string *)&local_150,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.indirect_contents.indirect != &local_140) {
    operator_delete(local_150.indirect_contents.indirect,
                    (ulong)(local_140._M_allocated_capacity + 1));
  }
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x361;
  file_01.m_begin = (iterator)&local_2e0;
  msg_01.m_end = in_R9;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2f0,
             msg_01);
  _Var2._M_head_impl = local_270._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a0.indirect_contents);
  local_d8 = local_88;
  local_d0 = local_80;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0.indirect_contents);
  local_140._8_8_ = local_d8;
  local_130 = local_d0;
  local_128.__d.__r = (duration)100000000;
  local_120 = NODE_NONE;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_150;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260,__l_00,
             (allocator_type *)&local_1e8);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add(_Var2._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_260,
                    (CNetAddr *)&local_78.indirect_contents,(seconds)0x0);
  local_58[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_110._0_8_ = "addrman->Add({CAddress(addr36, NODE_NONE)}, source)";
  local_110._8_8_ = "";
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_168._8_8_ = local_110;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2f8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_178,1,0,WARN,_cVar13,
             (size_t)&local_300,0x361);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260);
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_e0) {
    free(local_f0.indirect_contents.indirect);
    local_f0.indirect_contents.indirect = (char *)0x0;
  }
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x362;
  file_02.m_begin = (iterator)&local_310;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_320,
             msg_02);
  _Var2._M_head_impl = local_270._M_head_impl;
  tVar8 = NodeClock::now();
  bVar4 = AddrMan::Good(_Var2._M_head_impl,(CService *)&local_a0.indirect_contents,
                        (NodeSeconds)((long)tVar8.__d.__r / 1000000000));
  local_178[0] = !bVar4;
  local_178._8_8_ = (element_type *)0x0;
  aStack_168._M_allocated_capacity = 0;
  local_58._0_8_ = "!addrman->Good(addr36)";
  local_58._8_8_ = "";
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
  local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_328 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_140._8_8_ = (assertion_result *)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)&local_150,1,0,WARN,_cVar13,
             (size_t)&local_330,0x362);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_168._M_allocated_capacity);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x363;
  file_03.m_begin = (iterator)&local_340;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_350,
             msg_03);
  local_260.m_message.px = (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
  local_260._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_248 = (string *)0xf98c4c;
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_150,local_270._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_110,(CService *)&local_150);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_110,"250.1.1.19:0");
  local_1e8._M_dataplus._M_p._0_1_ = iVar6 == 0;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_228._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_228.m_message.px = (element_type *)0xe7eadc;
  aStack_168._8_8_ = &local_238;
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013d3d70;
  aStack_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_240;
  local_240 = (string *)0xe7ff5d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3eb0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pcVar12 = "addrman->SelectTriedCollision().first.ToStringAddrPort()";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_238 = (string *)local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e8,(lazy_ostream *)&local_260,1,2,REQUIRE,0xe7ff24,
             (size_t)&local_228,0x363,(assertion_result *)local_178,"\"250.1.1.19:0\"",
             (assertion_result *)local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1e8.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != &aStack_100) {
    operator_delete((void *)local_110._0_8_,aStack_100._M_allocated_capacity + 1);
  }
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  AddrMan::ResolveCollisions(local_270._M_head_impl);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x369;
  file_04.m_begin = (iterator)&local_360;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_370,
             msg_04);
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_150,local_270._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_178,(CService *)&local_150);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     "[::]:0");
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar6 == 0);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110._0_8_ = "addrman->SelectTriedCollision().first.ToStringAddrPort() == \"[::]:0\"";
  local_110._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_378 = "";
  pvVar10 = (iterator)0x0;
  aStack_48._8_8_ = (string *)local_110;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar12,(size_t)&local_380,
             0x369);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._0_8_ != &aStack_168) {
    operator_delete((void *)local_178._0_8_,(ulong)(aStack_168._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  local_228._0_4_ = 0x25;
  do {
    util::ToString<unsigned_int>((string *)local_58,(uint *)&local_228);
    pvVar11 = &DAT_00000008;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_58,0,0,"250.1.1.",8);
    local_150.indirect_contents.indirect = (char *)&local_140;
    ppuVar1 = (undefined1 **)(pbVar7->_M_dataplus)._M_p;
    paVar9 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppuVar1 == paVar9) {
      local_140._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_140._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_140._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_150.indirect_contents.indirect = (char *)ppuVar1;
    }
    local_150._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)local_178,(string *)&local_150,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.indirect_contents.indirect != &local_140) {
      operator_delete(local_150.indirect_contents.indirect,
                      (ulong)(local_140._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
    }
    local_390 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_388 = "";
    local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x36e;
    file_05.m_begin = (iterator)&local_390;
    msg_05.m_end = pvVar10;
    msg_05.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3a0,
               msg_05);
    _Var2._M_head_impl = local_270._M_head_impl;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_178);
    local_188 = (string **)aStack_168._8_8_;
    local_180 = local_158;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents);
    local_140._8_8_ = local_188;
    local_130 = local_180;
    local_128.__d.__r = (duration)100000000;
    local_120 = NODE_NONE;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_150;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)local_110,__l_01,
               (allocator_type *)&local_238);
    bVar4 = AddrMan::Add(_Var2._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)local_110
                         ,(CNetAddr *)&local_78.indirect_contents,(seconds)0x0);
    local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar4;
    local_260.m_message.px = (element_type *)0x0;
    local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1e8._M_dataplus._M_p = "addrman->Add({CAddress(addr, NODE_NONE)}, source)";
    local_1e8._M_string_length = 0xe7f4be;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
    aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_48._8_8_ = &local_1e8;
    local_3b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_3a8 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_260,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar12,(size_t)&local_3b0,
               0x36e);
    boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)local_110);
    if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
      free(local_150.indirect_contents.indirect);
      local_150.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < local_190) {
      free(local_1a0.indirect_contents.indirect);
      local_1a0.indirect_contents.indirect = (char *)0x0;
    }
    local_3c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_3b8 = "";
    local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x36f;
    file_06.m_begin = (iterator)&local_3c0;
    msg_06.m_end = pvVar11;
    msg_06.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3d0,
               msg_06);
    _Var2._M_head_impl = local_270._M_head_impl;
    tVar8 = NodeClock::now();
    bVar4 = AddrMan::Good(_Var2._M_head_impl,(CService *)local_178,
                          (NodeSeconds)((long)tVar8.__d.__r / 1000000000));
    local_58[0] = bVar4;
    local_58._8_8_ = (element_type *)0x0;
    aStack_48._M_allocated_capacity = 0;
    local_260._0_8_ = "addrman->Good(addr)";
    local_260.m_message.px = (element_type *)0xe7fef1;
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &local_260;
    local_3e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_3d8 = "";
    pvVar11 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,(lazy_ostream *)&local_150,1,0,WARN,(check_type)pcVar12,
               (size_t)&local_3e0,0x36f);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
    if (0x10 < (uint)aStack_168._M_allocated_capacity._0_4_) {
      free((void *)local_178._0_8_);
      local_178._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
    uVar5 = local_228._0_4_ + 1;
    local_228._0_4_ = uVar5;
  } while (uVar5 < 0x3b);
  local_150.indirect_contents.indirect = (char *)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"250.1.1.59","");
  ResolveService((CService *)local_178,(string *)&local_150,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.indirect_contents.indirect != &local_140) {
    operator_delete(local_150.indirect_contents.indirect,
                    (ulong)(local_140._M_allocated_capacity + 1));
  }
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x374;
  file_07.m_begin = (iterator)&local_3f0;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_400,
             msg_07);
  _Var2._M_head_impl = local_270._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_178);
  local_1b0 = (string **)aStack_168._8_8_;
  local_1a8 = local_158;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8.indirect_contents);
  local_140._8_8_ = local_1b0;
  local_130 = local_1a8;
  local_128.__d.__r = (duration)100000000;
  local_120 = NODE_NONE;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_150;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_110,__l_02,
             (allocator_type *)&local_228);
  bVar4 = AddrMan::Add(_Var2._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)local_110,
                       (CNetAddr *)&local_78.indirect_contents,(seconds)0x0);
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar4;
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._M_dataplus._M_p = "addrman->Add({CAddress(addr59, NODE_NONE)}, source)";
  local_1e8._M_string_length = 0xe7ffb7;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_1e8;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_408 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar12,(size_t)&local_410,
             0x374);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_110);
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_1b8) {
    free(local_1c8.indirect_contents.indirect);
    local_1c8.indirect_contents.indirect = (char *)0x0;
  }
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x375;
  file_08.m_begin = (iterator)&local_420;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_430,
             msg_08);
  _Var2._M_head_impl = local_270._M_head_impl;
  tVar8 = NodeClock::now();
  bVar4 = AddrMan::Good(_Var2._M_head_impl,(CService *)local_178,
                        (NodeSeconds)((long)tVar8.__d.__r / 1000000000));
  local_58[0] = !bVar4;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_260._0_8_ = "!addrman->Good(addr59)";
  local_260.m_message.px = (element_type *)0xe7ffce;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
  local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_438 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_140._8_8_ = &local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&local_150,1,0,WARN,(check_type)pcVar12,
             (size_t)&local_440,0x375);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x377;
  file_09.m_begin = (iterator)&local_450;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_460,
             msg_09);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110._0_8_ = &PTR__lazy_ostream_013d3cb0;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_150,local_270._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_(&local_1e8,(CService *)&local_150);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_1e8,"250.1.1.10:0");
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar6 == 0);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_238 = (string *)0xe7ea7d;
  local_230 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_240;
  local_248 = (string *)&local_268;
  local_268 = "250.1.1.10:0";
  local_260.m_message.px = (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
  local_260._0_8_ = &PTR__lazy_ostream_013d3eb0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar12 = "addrman->SelectTriedCollision().first.ToStringAddrPort()";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_240 = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)local_110,1,2,REQUIRE,0xe7ff24,(size_t)&local_238,0x377,
             (assertion_result *)local_58,"\"250.1.1.10:0\"",&local_260);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x37a;
  file_10.m_begin = (iterator)&local_470;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_480,
             msg_10);
  _Var2._M_head_impl = local_270._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_210.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a0.indirect_contents);
  local_1f8 = local_88;
  local_1f0 = local_80;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_210.indirect_contents);
  local_140._8_8_ = local_1f8;
  local_130 = local_1f0;
  local_128.__d.__r = (duration)100000000;
  local_120 = NODE_NONE;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_150;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_110,__l_03,
             (allocator_type *)&local_228);
  bVar4 = AddrMan::Add(_Var2._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)local_110,
                       (CNetAddr *)&local_78.indirect_contents,(seconds)0x0);
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._M_dataplus._M_p = "!addrman->Add({CAddress(addr36, NODE_NONE)}, source)";
  local_1e8._M_string_length = 0xe8001f;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_488 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  aStack_48._8_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar12,(size_t)&local_490,
             0x37a);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_110);
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_200) {
    free(local_210.indirect_contents.indirect);
    local_210.indirect_contents.indirect = (char *)0x0;
  }
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x37d;
  file_11.m_begin = (iterator)&local_4a0;
  msg_11.m_end = pvVar11;
  msg_11.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4b0,
             msg_11);
  _Var2._M_head_impl = local_270._M_head_impl;
  tVar8 = NodeClock::now();
  bVar4 = AddrMan::Good(_Var2._M_head_impl,(CService *)&local_a0.indirect_contents,
                        (NodeSeconds)((long)tVar8.__d.__r / 1000000000));
  local_58[0] = !bVar4;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_260._0_8_ = "!addrman->Good(addr36)";
  local_260.m_message.px = (element_type *)0xe7ff23;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
  local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4b8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_140._8_8_ = &local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&local_150,1,0,WARN,(check_type)pcVar12,
             (size_t)&local_4c0,0x37d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x37e;
  file_12.m_begin = (iterator)&local_4d0;
  msg_12.m_end = pvVar11;
  msg_12.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4e0,
             msg_12);
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_150,local_270._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_58,(CService *)&local_150);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "[::]:0");
  local_110[0] = iVar6 != 0;
  local_110._8_8_ = (element_type *)0x0;
  aStack_100._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p =
       "addrman->SelectTriedCollision().first.ToStringAddrPort() != \"[::]:0\"";
  local_1e8._M_string_length = 0xe80064;
  local_260.m_message.px = (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
  local_260._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4e8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_248 = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&local_260,1,0,WARN,(check_type)pcVar12,
             (size_t)&local_4f0,0x37e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_100._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  AddrMan::ResolveCollisions(local_270._M_head_impl);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x382;
  file_13.m_begin = (iterator)&local_500;
  msg_13.m_end = pvVar11;
  msg_13.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_510,
             msg_13);
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_150,local_270._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_58,(CService *)&local_150);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "[::]:0");
  local_110[0] = iVar6 == 0;
  local_110._8_8_ = (element_type *)0x0;
  aStack_100._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p =
       "addrman->SelectTriedCollision().first.ToStringAddrPort() == \"[::]:0\"";
  local_1e8._M_string_length = 0xe7fedc;
  local_260.m_message.px = (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
  local_260._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_518 = "";
  local_248 = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)&local_260,1,0,WARN,(check_type)pcVar12,
             (size_t)&local_520,0x382);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_100._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_168._M_allocated_capacity._0_4_) {
    free((void *)local_178._0_8_);
    local_178._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
  }
  if (0x10 < local_90) {
    free(local_a0.indirect_contents.indirect);
    local_a0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_68) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)&local_270);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_noevict)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    // Add 35 addresses.
    CNetAddr source = ResolveIP("252.2.2.2");
    for (unsigned int i = 1; i < 36; i++) {
        CService addr = ResolveService("250.1.1." + ToString(i));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));

        // No collision yet.
        BOOST_CHECK(addrman->Good(addr));
    }

    // Collision in tried table between 36 and 19.
    CService addr36 = ResolveService("250.1.1.36");
    BOOST_CHECK(addrman->Add({CAddress(addr36, NODE_NONE)}, source));
    BOOST_CHECK(!addrman->Good(addr36));
    BOOST_CHECK_EQUAL(addrman->SelectTriedCollision().first.ToStringAddrPort(), "250.1.1.19:0");

    // 36 should be discarded and 19 not evicted.
    // This means we keep 19 in the tried table and
    // 36 stays in the new table.
    addrman->ResolveCollisions();
    BOOST_CHECK(addrman->SelectTriedCollision().first.ToStringAddrPort() == "[::]:0");

    // Lets create two collisions.
    for (unsigned int i = 37; i < 59; i++) {
        CService addr = ResolveService("250.1.1." + ToString(i));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));
        BOOST_CHECK(addrman->Good(addr));
    }

    // Cause a collision in the tried table.
    CService addr59 = ResolveService("250.1.1.59");
    BOOST_CHECK(addrman->Add({CAddress(addr59, NODE_NONE)}, source));
    BOOST_CHECK(!addrman->Good(addr59));

    BOOST_CHECK_EQUAL(addrman->SelectTriedCollision().first.ToStringAddrPort(), "250.1.1.10:0");

    // Cause a second collision in the new table.
    BOOST_CHECK(!addrman->Add({CAddress(addr36, NODE_NONE)}, source));

    // 36 still cannot be moved from new to tried due to colliding with 19
    BOOST_CHECK(!addrman->Good(addr36));
    BOOST_CHECK(addrman->SelectTriedCollision().first.ToStringAddrPort() != "[::]:0");

    // Resolve all collisions.
    addrman->ResolveCollisions();
    BOOST_CHECK(addrman->SelectTriedCollision().first.ToStringAddrPort() == "[::]:0");
}